

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

CloningFilter *
helics::make_cloning_filter
          (InterfaceVisibility locality,FilterTypes type,Federate *mFed,string_view delivery,
          string_view name)

{
  element_type *peVar1;
  Filter *filt;
  Core *extraout_RDX;
  Core *extraout_RDX_00;
  Core *pCVar2;
  
  if (locality == GLOBAL) {
    filt = &Federate::registerGlobalCloningFilter
                      (mFed,name,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->super_Filter;
    pCVar2 = extraout_RDX;
  }
  else {
    filt = &Federate::registerCloningFilter
                      (mFed,name,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->super_Filter;
    pCVar2 = extraout_RDX_00;
  }
  addOperations(filt,type,pCVar2);
  if ((delivery._M_len != 0) &&
     (peVar1 = (filt->filtOp).
               super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (*peVar1->_vptr_FilterOperations[3])(peVar1,0xc,"add delivery",delivery._M_len,delivery._M_str);
  }
  return (CloningFilter *)filt;
}

Assistant:

CloningFilter& make_cloning_filter(InterfaceVisibility locality,
                                   FilterTypes type,
                                   Federate* mFed,
                                   std::string_view delivery,
                                   std::string_view name)

{
    auto& dfilt = (locality == InterfaceVisibility::GLOBAL) ?
        mFed->registerGlobalCloningFilter(name) :
        mFed->registerCloningFilter(name);
    addOperations(&dfilt, type, mFed->getCorePointer().get());
    if (!delivery.empty()) {
        dfilt.addDeliveryEndpoint(delivery);
    }
    return dfilt;
}